

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::LRN_x86_avx2::forward_inplace(LRN_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  uint _w;
  uint _h;
  size_t _elemsize;
  undefined1 auVar2 [32];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int *piVar12;
  undefined1 auVar13 [32];
  void *pvVar14;
  void *pvVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  long lVar19;
  _func_int **pp_Var20;
  undefined1 (*pauVar21) [32];
  ulong uVar22;
  int k;
  int iVar23;
  int iVar24;
  undefined1 (*pauVar25) [32];
  _func_int *p_Var26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  float *pfVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  int j;
  ulong uVar36;
  int iVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  Mat square_sum;
  Mat square_blob;
  Option opt_b;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  _w = bottom_top_blob->w;
  _h = bottom_top_blob->h;
  iVar24 = bottom_top_blob->c;
  _elemsize = bottom_top_blob->elemsize;
  square_blob.cstep = 0;
  square_blob.data = (Allocator *)0x0;
  square_blob.refcount._0_4_ = 0;
  square_blob.refcount._4_4_ = 0;
  square_blob.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  square_blob.elempack = 0;
  square_blob.allocator = (Allocator *)square_blob.data;
  square_blob.dims = (int)square_blob.refcount;
  square_blob.w = square_blob.refcount._4_4_;
  square_blob._48_8_ = square_blob.elemsize;
  square_blob.c = square_blob.elempack;
  Mat::create(&square_blob,_w,_h,iVar24,_elemsize,opt->workspace_allocator);
  iVar29 = -100;
  if ((square_blob.data == (void *)0x0) || ((long)square_blob.c * square_blob.cstep == 0))
  goto LAB_001d4523;
  iVar29 = _h * _w;
  iVar34 = 0;
  iVar18 = 0;
  if (0 < iVar24) {
    iVar18 = iVar24;
  }
  for (; iVar34 != iVar18; iVar34 = iVar34 + 1) {
    Mat::channel(&square_sum,bottom_top_blob,iVar34);
    pvVar14 = square_sum.data;
    Mat::~Mat(&square_sum);
    Mat::channel(&square_sum,&square_blob,iVar34);
    pvVar15 = square_sum.data;
    Mat::~Mat(&square_sum);
    lVar19 = 0;
    pauVar21 = (undefined1 (*) [32])pvVar15;
    pfVar30 = (float *)pvVar14;
    for (iVar23 = 0; iVar23 + 7 < iVar29; iVar23 = iVar23 + 8) {
      auVar10._4_4_ = pfVar30[1] * pfVar30[1];
      auVar10._0_4_ = *pfVar30 * *pfVar30;
      auVar10._8_4_ = pfVar30[2] * pfVar30[2];
      auVar10._12_4_ = pfVar30[3] * pfVar30[3];
      auVar10._16_4_ = pfVar30[4] * pfVar30[4];
      auVar10._20_4_ = pfVar30[5] * pfVar30[5];
      auVar10._24_4_ = pfVar30[6] * pfVar30[6];
      auVar10._28_4_ = pfVar30[7];
      *pauVar21 = auVar10;
      pfVar30 = pfVar30 + 8;
      pauVar21 = pauVar21 + 1;
      lVar19 = lVar19 + 8;
    }
    for (; (int)lVar19 < iVar29; lVar19 = lVar19 + 1) {
      fVar38 = *(float *)((long)pvVar14 + lVar19 * 4);
      *(float *)((long)pvVar15 + lVar19 * 4) = fVar38 * fVar38;
    }
  }
  pp_Var20 = this->_vptr_LRN_x86_avx2;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var20[-3]) == 0) {
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.allocator = (Allocator *)0x0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
    Mat::create(&square_sum,_w,_h,iVar24,_elemsize,opt->workspace_allocator);
    if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0)) {
LAB_001d4516:
      Mat::~Mat(&square_sum);
      iVar29 = -100;
      goto LAB_001d4523;
    }
    Mat::fill(&square_sum,0.0);
    fVar38 = *(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_avx2[-3]) /
             (float)*(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx2[-3]);
    auVar40._8_4_ = 0xffffff82;
    auVar40._0_8_ = 0xffffff82ffffff82;
    auVar40._12_4_ = 0xffffff82;
    auVar40._16_4_ = 0xffffff82;
    auVar40._20_4_ = 0xffffff82;
    auVar40._24_4_ = 0xffffff82;
    auVar40._28_4_ = 0xffffff82;
    for (iVar34 = 0; iVar34 != iVar18; iVar34 = iVar34 + 1) {
      iVar23 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx2[-3]);
      for (iVar37 = iVar23 / -2 + iVar34; iVar37 <= iVar23 / 2 + iVar34; iVar37 = iVar37 + 1) {
        if (iVar37 < iVar24 && -1 < iVar37) {
          Mat::channel((Mat *)&opt_b,&square_blob,iVar37);
          uVar16 = opt_b._0_8_;
          Mat::~Mat((Mat *)&opt_b);
          Mat::channel((Mat *)&opt_b,&square_sum,iVar34);
          uVar17 = opt_b._0_8_;
          Mat::~Mat((Mat *)&opt_b);
          lVar19 = 0;
          pauVar21 = (undefined1 (*) [32])uVar17;
          pfVar30 = (float *)uVar16;
          for (iVar23 = 0; iVar23 + 7 < iVar29; iVar23 = iVar23 + 8) {
            auVar41._0_4_ = *(float *)*pauVar21 + *pfVar30;
            auVar41._4_4_ = *(float *)(*pauVar21 + 4) + pfVar30[1];
            auVar41._8_4_ = *(float *)(*pauVar21 + 8) + pfVar30[2];
            auVar41._12_4_ = *(float *)(*pauVar21 + 0xc) + pfVar30[3];
            auVar41._16_4_ = *(float *)(*pauVar21 + 0x10) + pfVar30[4];
            auVar41._20_4_ = *(float *)(*pauVar21 + 0x14) + pfVar30[5];
            auVar41._24_4_ = *(float *)(*pauVar21 + 0x18) + pfVar30[6];
            auVar41._28_4_ = *(float *)(*pauVar21 + 0x1c) + pfVar30[7];
            *pauVar21 = auVar41;
            pfVar30 = pfVar30 + 8;
            pauVar21 = pauVar21 + 1;
            lVar19 = lVar19 + 8;
          }
          for (; (int)lVar19 < iVar29; lVar19 = lVar19 + 1) {
            *(float *)(uVar17 + lVar19 * 4) =
                 *(float *)(uVar17 + lVar19 * 4) + *(float *)(uVar16 + lVar19 * 4);
          }
          iVar23 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx2[-3]);
        }
      }
      Mat::channel((Mat *)&opt_b,bottom_top_blob,iVar34);
      uVar16 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      Mat::channel((Mat *)&opt_b,&square_sum,iVar34);
      uVar17 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      pp_Var20 = this->_vptr_LRN_x86_avx2;
      p_Var26 = pp_Var20[-3];
      uVar1 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var26);
      auVar42._4_4_ = uVar1;
      auVar42._0_4_ = uVar1;
      auVar42._8_4_ = uVar1;
      auVar42._12_4_ = uVar1;
      auVar42._16_4_ = uVar1;
      auVar42._20_4_ = uVar1;
      auVar42._24_4_ = uVar1;
      auVar42._28_4_ = uVar1;
      fVar39 = -*(float *)(&this->field_0xdc + (long)p_Var26);
      lVar19 = 0;
      pauVar21 = (undefined1 (*) [32])uVar16;
      pauVar25 = (undefined1 (*) [32])uVar17;
      for (iVar23 = 0; iVar23 + 7 < iVar29; iVar23 = iVar23 + 8) {
        auVar2._4_4_ = fVar38;
        auVar2._0_4_ = fVar38;
        auVar2._8_4_ = fVar38;
        auVar2._12_4_ = fVar38;
        auVar2._16_4_ = fVar38;
        auVar2._20_4_ = fVar38;
        auVar2._24_4_ = fVar38;
        auVar2._28_4_ = fVar38;
        auVar9 = vfmadd132ps_fma(*pauVar25,auVar42,auVar2);
        auVar46._8_4_ = 0x800000;
        auVar46._0_8_ = 0x80000000800000;
        auVar46._12_4_ = 0x800000;
        auVar46._16_4_ = 0x800000;
        auVar46._20_4_ = 0x800000;
        auVar46._24_4_ = 0x800000;
        auVar46._28_4_ = 0x800000;
        auVar2 = vmaxps_avx(ZEXT1632(auVar9),auVar46);
        auVar13._8_4_ = 0x807fffff;
        auVar13._0_8_ = 0x807fffff807fffff;
        auVar13._12_4_ = 0x807fffff;
        auVar13._16_4_ = 0x807fffff;
        auVar13._20_4_ = 0x807fffff;
        auVar13._24_4_ = 0x807fffff;
        auVar13._28_4_ = 0x807fffff;
        auVar47 = vandps_avx(auVar2,auVar13);
        auVar11._8_4_ = 0x3f000000;
        auVar11._0_8_ = 0x3f0000003f000000;
        auVar11._12_4_ = 0x3f000000;
        auVar11._16_4_ = 0x3f000000;
        auVar11._20_4_ = 0x3f000000;
        auVar11._24_4_ = 0x3f000000;
        auVar11._28_4_ = 0x3f000000;
        auVar7 = vorps_avx(auVar47,auVar11);
        auVar54._8_4_ = 0x3f3504f3;
        auVar54._0_8_ = 0x3f3504f33f3504f3;
        auVar54._12_4_ = 0x3f3504f3;
        auVar54._16_4_ = 0x3f3504f3;
        auVar54._20_4_ = 0x3f3504f3;
        auVar54._24_4_ = 0x3f3504f3;
        auVar54._28_4_ = 0x3f3504f3;
        auVar43 = vcmpps_avx(auVar7,auVar54,1);
        auVar47 = vandps_avx(auVar43,auVar7);
        auVar52._0_4_ = auVar7._0_4_ + -1.0 + auVar47._0_4_;
        auVar52._4_4_ = auVar7._4_4_ + -1.0 + auVar47._4_4_;
        auVar52._8_4_ = auVar7._8_4_ + -1.0 + auVar47._8_4_;
        auVar52._12_4_ = auVar7._12_4_ + -1.0 + auVar47._12_4_;
        auVar52._16_4_ = auVar7._16_4_ + -1.0 + auVar47._16_4_;
        auVar52._20_4_ = auVar7._20_4_ + -1.0 + auVar47._20_4_;
        auVar52._24_4_ = auVar7._24_4_ + -1.0 + auVar47._24_4_;
        auVar52._28_4_ = auVar7._28_4_ + -1.0 + auVar47._28_4_;
        auVar7 = vcmpps_avx(ZEXT1632(auVar9),_DAT_002da820,2);
        auVar47 = vpsrld_avx2(auVar2,0x17);
        auVar47 = vpaddd_avx2(auVar47,auVar40);
        auVar2 = vcvtdq2ps_avx(auVar47);
        auVar57._8_4_ = 0x3f800000;
        auVar57._0_8_ = 0x3f8000003f800000;
        auVar57._12_4_ = 0x3f800000;
        auVar57._16_4_ = 0x3f800000;
        auVar57._20_4_ = 0x3f800000;
        auVar57._24_4_ = 0x3f800000;
        auVar57._28_4_ = 0x3f800000;
        auVar47 = vandps_avx(auVar43,auVar57);
        auVar47 = vsubps_avx(auVar2,auVar47);
        auVar55._8_4_ = 0x3d9021bb;
        auVar55._0_8_ = 0x3d9021bb3d9021bb;
        auVar55._12_4_ = 0x3d9021bb;
        auVar55._16_4_ = 0x3d9021bb;
        auVar55._20_4_ = 0x3d9021bb;
        auVar55._24_4_ = 0x3d9021bb;
        auVar55._28_4_ = 0x3d9021bb;
        auVar58._8_4_ = 0xbdebd1b8;
        auVar58._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar58._12_4_ = 0xbdebd1b8;
        auVar58._16_4_ = 0xbdebd1b8;
        auVar58._20_4_ = 0xbdebd1b8;
        auVar58._24_4_ = 0xbdebd1b8;
        auVar58._28_4_ = 0xbdebd1b8;
        auVar9 = vfmadd213ps_fma(auVar55,auVar52,auVar58);
        auVar59._8_4_ = 0x3def251a;
        auVar59._0_8_ = 0x3def251a3def251a;
        auVar59._12_4_ = 0x3def251a;
        auVar59._16_4_ = 0x3def251a;
        auVar59._20_4_ = 0x3def251a;
        auVar59._24_4_ = 0x3def251a;
        auVar59._28_4_ = 0x3def251a;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar52,auVar59);
        auVar60._8_4_ = 0xbdfe5d4f;
        auVar60._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar60._12_4_ = 0xbdfe5d4f;
        auVar60._16_4_ = 0xbdfe5d4f;
        auVar60._20_4_ = 0xbdfe5d4f;
        auVar60._24_4_ = 0xbdfe5d4f;
        auVar60._28_4_ = 0xbdfe5d4f;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar52,auVar60);
        auVar61._8_4_ = 0x3e11e9bf;
        auVar61._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar61._12_4_ = 0x3e11e9bf;
        auVar61._16_4_ = 0x3e11e9bf;
        auVar61._20_4_ = 0x3e11e9bf;
        auVar61._24_4_ = 0x3e11e9bf;
        auVar61._28_4_ = 0x3e11e9bf;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar52,auVar61);
        auVar62._8_4_ = 0xbe2aae50;
        auVar62._0_8_ = 0xbe2aae50be2aae50;
        auVar62._12_4_ = 0xbe2aae50;
        auVar62._16_4_ = 0xbe2aae50;
        auVar62._20_4_ = 0xbe2aae50;
        auVar62._24_4_ = 0xbe2aae50;
        auVar62._28_4_ = 0xbe2aae50;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar52,auVar62);
        auVar63._8_4_ = 0x3e4cceac;
        auVar63._0_8_ = 0x3e4cceac3e4cceac;
        auVar63._12_4_ = 0x3e4cceac;
        auVar63._16_4_ = 0x3e4cceac;
        auVar63._20_4_ = 0x3e4cceac;
        auVar63._24_4_ = 0x3e4cceac;
        auVar63._28_4_ = 0x3e4cceac;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar52,auVar63);
        auVar64._8_4_ = 0xbe7ffffc;
        auVar64._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar64._12_4_ = 0xbe7ffffc;
        auVar64._16_4_ = 0xbe7ffffc;
        auVar64._20_4_ = 0xbe7ffffc;
        auVar64._24_4_ = 0xbe7ffffc;
        auVar64._28_4_ = 0xbe7ffffc;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar52,auVar64);
        auVar65._8_4_ = 0x3eaaaaaa;
        auVar65._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar65._12_4_ = 0x3eaaaaaa;
        auVar65._16_4_ = 0x3eaaaaaa;
        auVar65._20_4_ = 0x3eaaaaaa;
        auVar65._24_4_ = 0x3eaaaaaa;
        auVar65._28_4_ = 0x3eaaaaaa;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar52,auVar65);
        auVar71._8_4_ = 0xbf000000;
        auVar71._0_8_ = 0xbf000000bf000000;
        auVar71._12_4_ = 0xbf000000;
        auVar71._16_4_ = 0xbf000000;
        auVar71._20_4_ = 0xbf000000;
        auVar71._24_4_ = 0xbf000000;
        auVar71._28_4_ = 0xbf000000;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar52,auVar71);
        auVar66._8_4_ = 0x3f317218;
        auVar66._0_8_ = 0x3f3172183f317218;
        auVar66._12_4_ = 0x3f317218;
        auVar66._16_4_ = 0x3f317218;
        auVar66._20_4_ = 0x3f317218;
        auVar66._24_4_ = 0x3f317218;
        auVar66._28_4_ = 0x3f317218;
        auVar8 = vfmadd213ps_fma(auVar47,auVar66,auVar52);
        auVar47._4_4_ = auVar52._4_4_ * auVar52._4_4_;
        auVar47._0_4_ = auVar52._0_4_ * auVar52._0_4_;
        auVar47._8_4_ = auVar52._8_4_ * auVar52._8_4_;
        auVar47._12_4_ = auVar52._12_4_ * auVar52._12_4_;
        auVar47._16_4_ = auVar52._16_4_ * auVar52._16_4_;
        auVar47._20_4_ = auVar52._20_4_ * auVar52._20_4_;
        auVar47._24_4_ = auVar52._24_4_ * auVar52._24_4_;
        auVar47._28_4_ = auVar52._28_4_;
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar47,ZEXT1632(auVar9));
        auVar47 = vorps_avx(auVar7,ZEXT1632(auVar9));
        auVar43._4_4_ = auVar47._4_4_ * fVar39;
        auVar43._0_4_ = auVar47._0_4_ * fVar39;
        auVar43._8_4_ = auVar47._8_4_ * fVar39;
        auVar43._12_4_ = auVar47._12_4_ * fVar39;
        auVar43._16_4_ = auVar47._16_4_ * fVar39;
        auVar43._20_4_ = auVar47._20_4_ * fVar39;
        auVar43._24_4_ = auVar47._24_4_ * fVar39;
        auVar43._28_4_ = auVar47._28_4_;
        auVar48._8_4_ = 0x42b0c0a5;
        auVar48._0_8_ = 0x42b0c0a542b0c0a5;
        auVar48._12_4_ = 0x42b0c0a5;
        auVar48._16_4_ = 0x42b0c0a5;
        auVar48._20_4_ = 0x42b0c0a5;
        auVar48._24_4_ = 0x42b0c0a5;
        auVar48._28_4_ = 0x42b0c0a5;
        auVar47 = vminps_avx(auVar43,auVar48);
        auVar49._8_4_ = 0xc2b0c0a5;
        auVar49._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar49._12_4_ = 0xc2b0c0a5;
        auVar49._16_4_ = 0xc2b0c0a5;
        auVar49._20_4_ = 0xc2b0c0a5;
        auVar49._24_4_ = 0xc2b0c0a5;
        auVar49._28_4_ = 0xc2b0c0a5;
        auVar43 = vmaxps_avx(auVar47,auVar49);
        auVar50._8_4_ = 0x3fb8aa3b;
        auVar50._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar50._12_4_ = 0x3fb8aa3b;
        auVar50._16_4_ = 0x3fb8aa3b;
        auVar50._20_4_ = 0x3fb8aa3b;
        auVar50._24_4_ = 0x3fb8aa3b;
        auVar50._28_4_ = 0x3fb8aa3b;
        auVar9 = vfmsub213ps_fma(auVar50,auVar43,auVar71);
        auVar7 = vroundps_avx(ZEXT1632(auVar9),1);
        auVar47 = vcmpps_avx(ZEXT1632(auVar9),auVar7,1);
        auVar47 = vandps_avx(auVar47,auVar57);
        auVar47 = vsubps_avx(auVar7,auVar47);
        auVar8 = vfnmadd231ps_fma(auVar43,auVar47,auVar66);
        auVar43 = ZEXT1632(auVar8);
        fVar3 = auVar8._0_4_;
        fVar4 = auVar8._4_4_;
        fVar5 = auVar8._8_4_;
        fVar6 = auVar8._12_4_;
        auVar7._28_4_ = auVar7._28_4_;
        auVar7._0_28_ =
             ZEXT1628(CONCAT412(fVar6 * fVar6,
                                CONCAT48(fVar5 * fVar5,CONCAT44(fVar4 * fVar4,fVar3 * fVar3))));
        auVar56._8_4_ = 0x39506967;
        auVar56._0_8_ = 0x3950696739506967;
        auVar56._12_4_ = 0x39506967;
        auVar56._16_4_ = 0x39506967;
        auVar56._20_4_ = 0x39506967;
        auVar56._24_4_ = 0x39506967;
        auVar56._28_4_ = 0x39506967;
        auVar67._8_4_ = 0x3ab743ce;
        auVar67._0_8_ = 0x3ab743ce3ab743ce;
        auVar67._12_4_ = 0x3ab743ce;
        auVar67._16_4_ = 0x3ab743ce;
        auVar67._20_4_ = 0x3ab743ce;
        auVar67._24_4_ = 0x3ab743ce;
        auVar67._28_4_ = 0x3ab743ce;
        auVar9 = vfmadd213ps_fma(auVar56,auVar43,auVar67);
        auVar68._8_4_ = 0x3c088908;
        auVar68._0_8_ = 0x3c0889083c088908;
        auVar68._12_4_ = 0x3c088908;
        auVar68._16_4_ = 0x3c088908;
        auVar68._20_4_ = 0x3c088908;
        auVar68._24_4_ = 0x3c088908;
        auVar68._28_4_ = 0x3c088908;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar43,auVar68);
        auVar69._8_4_ = 0x3d2aa9c1;
        auVar69._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar69._12_4_ = 0x3d2aa9c1;
        auVar69._16_4_ = 0x3d2aa9c1;
        auVar69._20_4_ = 0x3d2aa9c1;
        auVar69._24_4_ = 0x3d2aa9c1;
        auVar69._28_4_ = 0x3d2aa9c1;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar43,auVar69);
        auVar70._8_4_ = 0x3e2aaaaa;
        auVar70._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar70._12_4_ = 0x3e2aaaaa;
        auVar70._16_4_ = 0x3e2aaaaa;
        auVar70._20_4_ = 0x3e2aaaaa;
        auVar70._24_4_ = 0x3e2aaaaa;
        auVar70._28_4_ = 0x3e2aaaaa;
        auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar70);
        auVar9 = vfmsub213ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar8),auVar71);
        auVar44._0_4_ = fVar3 + 1.0;
        auVar44._4_4_ = fVar4 + 1.0;
        auVar44._8_4_ = fVar5 + 1.0;
        auVar44._12_4_ = fVar6 + 1.0;
        auVar44._16_4_ = 0x3f800000;
        auVar44._20_4_ = 0x3f800000;
        auVar44._24_4_ = 0x3f800000;
        auVar44._28_4_ = 0x3f800000;
        auVar9 = vfmadd231ps_fma(auVar44,auVar7,ZEXT1632(auVar9));
        auVar51._0_4_ = (int)auVar47._0_4_;
        auVar51._4_4_ = (int)auVar47._4_4_;
        auVar51._8_4_ = (int)auVar47._8_4_;
        auVar51._12_4_ = (int)auVar47._12_4_;
        auVar51._16_4_ = (int)auVar47._16_4_;
        auVar51._20_4_ = (int)auVar47._20_4_;
        auVar51._24_4_ = (int)auVar47._24_4_;
        auVar51._28_4_ = (int)auVar47._28_4_;
        auVar47 = vpslld_avx2(auVar51,0x17);
        auVar53._8_4_ = 0x3f800000;
        auVar53._0_8_ = 0x3f8000003f800000;
        auVar53._12_4_ = 0x3f800000;
        auVar53._16_4_ = 0x3f800000;
        auVar53._20_4_ = 0x3f800000;
        auVar53._24_4_ = 0x3f800000;
        auVar53._28_4_ = 0x3f800000;
        auVar47 = vpaddd_avx2(auVar47,auVar53);
        auVar45._0_4_ = auVar47._0_4_ * *(float *)*pauVar21 * auVar9._0_4_;
        auVar45._4_4_ = auVar47._4_4_ * *(float *)(*pauVar21 + 4) * auVar9._4_4_;
        auVar45._8_4_ = auVar47._8_4_ * *(float *)(*pauVar21 + 8) * auVar9._8_4_;
        auVar45._12_4_ = auVar47._12_4_ * *(float *)(*pauVar21 + 0xc) * auVar9._12_4_;
        auVar45._16_4_ = auVar47._16_4_ * *(float *)(*pauVar21 + 0x10) * 0.0;
        auVar45._20_4_ = auVar47._20_4_ * *(float *)(*pauVar21 + 0x14) * 0.0;
        auVar45._24_4_ = auVar47._24_4_ * *(float *)(*pauVar21 + 0x18) * 0.0;
        auVar45._28_4_ = 0;
        *pauVar21 = auVar45;
        pauVar25 = pauVar25 + 1;
        pauVar21 = pauVar21 + 1;
        lVar19 = lVar19 + 8;
      }
      for (; (int)lVar19 < iVar29; lVar19 = lVar19 + 1) {
        p_Var26 = pp_Var20[-3];
        auVar9 = vfmadd213ss_fma(ZEXT416(*(uint *)(uVar17 + lVar19 * 4)),ZEXT416((uint)fVar38),
                                 ZEXT416(*(uint *)(&this->field_0xe0 + (long)p_Var26)));
        fVar39 = powf(auVar9._0_4_,-*(float *)(&this->field_0xdc + (long)p_Var26));
        *(float *)(uVar16 + lVar19 * 4) = fVar39 * *(float *)(uVar16 + lVar19 * 4);
      }
    }
  }
  else {
    iVar29 = 0;
    if (*(int *)(&this->field_0xd0 + (long)pp_Var20[-3]) != 1) goto LAB_001d4523;
    piVar12 = (int *)CONCAT44(square_blob.refcount._4_4_,(int)square_blob.refcount);
    square_sum.data = square_blob.data;
    square_sum.refcount._0_4_ = (int)square_blob.refcount;
    square_sum.refcount._4_4_ = square_blob.refcount._4_4_;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = (undefined4)(square_blob.elemsize >> 0x20);
    square_sum.elempack = square_blob.elempack;
    square_sum.allocator = square_blob.allocator;
    square_sum.dims = square_blob.dims;
    square_sum.w = square_blob.w;
    square_sum.h = square_blob.h;
    square_sum.d = square_blob.d;
    square_sum.c = square_blob.c;
    square_sum.cstep = square_blob.cstep;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
      pp_Var20 = this->_vptr_LRN_x86_avx2;
    }
    p_Var26 = pp_Var20[-3];
    uVar28 = *(uint *)(&this->field_0xd4 + (long)p_Var26);
    uVar35 = _w;
    if (1 < (int)uVar28) {
      uVar28 = uVar28 >> 1;
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.openmp_blocktime = opt->openmp_blocktime;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_bf16_storage = opt->use_bf16_storage;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_packed = opt->use_int8_packed;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b.use_shader_pack8 = opt->use_shader_pack8;
      opt_b.use_subgroup_basic = opt->use_subgroup_basic;
      opt_b.use_subgroup_vote = opt->use_subgroup_vote;
      opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_b.use_image_storage = opt->use_image_storage;
      opt_b.use_tensor_storage = opt->use_tensor_storage;
      opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      opt_b.flush_denormals = opt->flush_denormals;
      opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_b.use_reserved_1 = opt->use_reserved_1;
      opt_b.use_reserved_2 = opt->use_reserved_2;
      opt_b.use_reserved_3 = opt->use_reserved_3;
      opt_b.use_reserved_4 = opt->use_reserved_4;
      opt_b.use_reserved_5 = opt->use_reserved_5;
      opt_b.use_reserved_6 = opt->use_reserved_6;
      opt_b.use_reserved_7 = opt->use_reserved_7;
      opt_b.use_reserved_8 = opt->use_reserved_8;
      opt_b.use_reserved_9 = opt->use_reserved_9;
      opt_b.use_reserved_10 = opt->use_reserved_10;
      opt_b.use_reserved_11 = opt->use_reserved_11;
      opt_b.blob_allocator = opt->workspace_allocator;
      iVar24 = ~uVar28 + *(int *)(&this->field_0xd4 + (long)pp_Var20[-3]);
      copy_make_border(&square_blob,&square_sum,uVar28,iVar24,uVar28,iVar24,0,0.0,&opt_b);
      if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0))
      goto LAB_001d4516;
      p_Var26 = this->_vptr_LRN_x86_avx2[-3];
      uVar28 = *(uint *)(&this->field_0xd4 + (long)p_Var26);
      uVar35 = square_sum.w;
    }
    uVar28 = uVar28 * uVar28;
    fVar38 = *(float *)(&this->field_0xd8 + (long)p_Var26);
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(ulong)uVar28,(allocator_type *)&opt_b);
    pp_Var20 = this->_vptr_LRN_x86_avx2;
    iVar24 = *(int *)(&this->field_0xd4 + (long)pp_Var20[-3]);
    iVar23 = uVar35 - iVar24;
    lVar19 = 0;
    iVar29 = 0;
    for (iVar34 = 0; iVar34 < iVar24; iVar34 = iVar34 + 1) {
      for (lVar31 = 0; iVar37 = (int)lVar31, iVar37 < iVar24; lVar31 = lVar31 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar19 + lVar31] = iVar29 + iVar37;
        iVar24 = *(int *)(&this->field_0xd4 + (long)pp_Var20[-3]);
      }
      iVar29 = iVar29 + iVar23 + iVar37;
      lVar19 = (int)lVar19 + lVar31;
    }
    uVar22 = 0;
    uVar32 = (ulong)_w;
    if ((int)_w < 1) {
      uVar32 = uVar22;
    }
    uVar33 = (ulong)_h;
    if ((int)_h < 1) {
      uVar33 = uVar22;
    }
    while( true ) {
      iVar24 = (int)uVar22;
      if (iVar24 == iVar18) break;
      Mat::channel((Mat *)&opt_b,bottom_top_blob,iVar24);
      lVar19 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      Mat::channel((Mat *)&opt_b,&square_sum,iVar24);
      for (uVar22 = 0; uVar22 != uVar33; uVar22 = uVar22 + 1) {
        lVar31 = (long)(int)opt_b._44_4_ * uVar22 * (long)opt_b.workspace_allocator + opt_b._0_8_;
        pp_Var20 = this->_vptr_LRN_x86_avx2;
        for (uVar36 = 0; uVar36 != uVar32; uVar36 = uVar36 + 1) {
          fVar39 = 0.0;
          for (uVar27 = 0; uVar28 != uVar27; uVar27 = uVar27 + 1) {
            fVar39 = fVar39 + *(float *)(lVar31 + uVar36 * 4 +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar27] * 4);
          }
          auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar39 * fVar38)),
                                   ZEXT416((uint)(1.0 / (float)(int)uVar28)),
                                   ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var20[-3])));
          fVar39 = powf(auVar9._0_4_,-*(float *)(&this->field_0xdc + (long)pp_Var20[-3]));
          *(float *)(lVar19 + uVar36 * 4) = fVar39 * *(float *)(lVar19 + uVar36 * 4);
        }
        lVar19 = lVar19 + (long)(int)_w * 4;
      }
      Mat::~Mat((Mat *)&opt_b);
      uVar22 = (ulong)(iVar24 + 1);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&square_sum);
  iVar29 = 0;
LAB_001d4523:
  Mat::~Mat(&square_blob);
  return iVar29;
}

Assistant:

int LRN_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}